

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.h
# Opt level: O0

void __thiscall
Js::JavascriptExceptionObject::JavascriptExceptionObject
          (JavascriptExceptionObject *this,Var object,ScriptContext *scriptContext,
          JavascriptExceptionContext *exceptionContextIn,bool isPendingExceptionObject)

{
  nullptr_t local_40;
  nullptr_t local_38;
  byte local_29;
  JavascriptExceptionContext *pJStack_28;
  bool isPendingExceptionObject_local;
  JavascriptExceptionContext *exceptionContextIn_local;
  ScriptContext *scriptContext_local;
  Var object_local;
  JavascriptExceptionObject *this_local;
  
  local_29 = isPendingExceptionObject;
  pJStack_28 = exceptionContextIn;
  exceptionContextIn_local = (JavascriptExceptionContext *)scriptContext;
  scriptContext_local = (ScriptContext *)object;
  object_local = this;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->thrownObject,object);
  Memory::WriteBarrierPtr<Js::ScriptContext>::WriteBarrierPtr
            (&this->scriptContext,(ScriptContext *)exceptionContextIn_local);
  this->byteCodeOffsetAfterDebuggerSkip = -1;
  this->field_0x14 = this->field_0x14 & 0xfe | 1;
  this->field_0x14 = this->field_0x14 & 0xfd | (local_29 & 1) << 1;
  this->field_0x14 = this->field_0x14 & 0xfb;
  this->field_0x14 = this->field_0x14 & 0xf7;
  this->field_0x14 = this->field_0x14 & 0xef;
  this->field_0x14 = this->field_0x14 & 0xdf;
  this->field_0x14 = this->field_0x14 & 0xbf;
  this->hostWrapperCreateFunc = (Type)0x0;
  JavascriptExceptionContext::JavascriptExceptionContext(&this->exceptionContext);
  Memory::WriteBarrierPtr<StackBackTrace>::WriteBarrierPtr(&this->stackBackTrace);
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptExceptionObject>::WriteBarrierPtr(&this->next,&local_38);
  if (pJStack_28 == (JavascriptExceptionContext *)0x0) {
    memset(&this->exceptionContext,0,0x20);
  }
  else {
    JavascriptExceptionContext::operator=(&this->exceptionContext,pJStack_28);
  }
  local_40 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<StackBackTrace>::operator=(&this->stackBackTrace,&local_40);
  return;
}

Assistant:

JavascriptExceptionObject(Var object, ScriptContext * scriptContext, JavascriptExceptionContext* exceptionContextIn, bool isPendingExceptionObject = false) :
            thrownObject(object),
            isPendingExceptionObject(isPendingExceptionObject),
            scriptContext(scriptContext), tag(true),
#ifdef ENABLE_SCRIPT_DEBUGGING
            isDebuggerSkip(false), byteCodeOffsetAfterDebuggerSkip(Constants::InvalidByteCodeOffset), hasDebuggerLogged(false),
            isFirstChance(false), isExceptionCaughtInNonUserCode(false), ignoreAdvanceToNextStatement(false),
#endif
            hostWrapperCreateFunc(nullptr),
            next(nullptr)
        {
            if (exceptionContextIn)
            {
                exceptionContext = *exceptionContextIn;
            }
            else
            {
                memset(&exceptionContext, 0, sizeof(exceptionContext));
            }
#if ENABLE_DEBUG_STACK_BACK_TRACE
            this->stackBackTrace = nullptr;
#endif
        }